

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O2

int duckdb::DecimalScaleUpCheckOperator::Operation<long,int>
              (long input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  int iVar1;
  uint8_t in_R8B;
  undefined7 in_register_00000081;
  string error;
  allocator local_a9;
  string local_a8;
  string local_88;
  string local_68 [32];
  string local_48;
  
  if (input < *(long *)((long)dataptr + 0x20) && -*(long *)((long)dataptr + 0x20) < input) {
    iVar1 = Cast::Operation<long,int>(input);
    iVar1 = iVar1 * *(int *)((long)dataptr + 0x28);
  }
  else {
    ::std::__cxx11::string::string
              (local_68,"Casting value \"%s\" to type %s failed: value is out of range!",&local_a9);
    Decimal::ToString_abi_cxx11_
              (&local_88,(Decimal *)input,(ulong)*(byte *)((long)dataptr + 0x2c),
               *(uint8_t *)((long)dataptr + 0x2d),in_R8B);
    LogicalType::ToString_abi_cxx11_(&local_a8,(LogicalType *)(*dataptr + 8));
    StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
              (&local_48,(StringUtil *)local_68,&local_88,&local_a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71(in_register_00000081,in_R8B));
    ::std::__cxx11::string::~string((string *)&local_a8);
    ::std::__cxx11::string::~string((string *)&local_88);
    ::std::__cxx11::string::~string(local_68);
    iVar1 = HandleVectorCastError::Operation<int>
                      (&local_48,mask,idx,(VectorTryCastData *)((long)dataptr + 8));
    ::std::__cxx11::string::~string((string *)&local_48);
  }
  return iVar1;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = (DecimalScaleInput<INPUT_TYPE, RESULT_TYPE> *)dataptr;
		if (input >= data->limit || input <= -data->limit) {
			auto error = StringUtil::Format("Casting value \"%s\" to type %s failed: value is out of range!",
			                                Decimal::ToString(input, data->source_width, data->source_scale),
			                                data->result.GetType().ToString());
			return HandleVectorCastError::Operation<RESULT_TYPE>(std::move(error), mask, idx, data->vector_cast_data);
		}
		return Cast::Operation<INPUT_TYPE, RESULT_TYPE>(input) * data->factor;
	}